

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_set_failure_indexBeyondSize_bufferExpansionFailed_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char **ppcVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_90;
  char *pcStack_88;
  char *pcStack_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined8 uStack_60;
  char c;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = (char *)0x3;
  local_38 = private_ACUtilsTest_ADynArray_growStrategy;
  local_28 = (char *)0x3;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_60 = 0x117bdd;
  local_20 = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,4);
  builtin_strncpy(local_20,"012",4);
  private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
  private_ACUtilsTest_ADynArray_reallocFail = 1;
  c = '3';
  uStack_60 = 0x117c19;
  bVar1 = private_ACUtils_ADynArray_setRange(&local_48,3,1,&c,1);
  if (bVar1 != false) {
    local_78 = (char *)(ulong)bVar1;
    ppcVar4 = &local_78;
    local_70 = "false";
    pcVar6 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar8 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar7 = 
    "private_ACUtils_ADynArray_setRange(&array, 3, 1, &(c), sizeof(*(&array)->buffer)) == false";
    pcVar3 = "private_ACUtils_ADynArray_setRange(&array, 3, 1, &(c), sizeof(*(&array)->buffer))";
    iVar2 = 0x69f;
    goto LAB_00117e15;
  }
  uStack_60 = 0x117c32;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x69f);
  if (local_30 == (char *)0x3) {
    uStack_60 = 0x117c52;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x6a0);
    if (local_28 == (char *)0x3) {
      uStack_60 = 0x117c72;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x6a1);
      if (local_20 == (char *)0x0) {
        ppcVar4 = &local_68;
        pcVar6 = "Assertion \'_ck_x != NULL\' failed";
        pcVar8 = "Assertion \'%s\' failed: %s == %#x";
        pcVar7 = "(void*) array.buffer != NULL";
        pcVar3 = "(void*) array.buffer";
        iVar2 = 0x6a2;
LAB_00117e15:
        uStack_60 = 0;
        local_68 = (char *)0x0;
        *(undefined8 *)((long)ppcVar4 + -8) = 0x117e1c;
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,iVar2,pcVar6,pcVar8,pcVar7,pcVar3);
      }
      uStack_60 = 0x117c8f;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x6a2);
      if (local_38 == (code *)0x0) {
        ppcVar4 = &local_68;
        pcVar6 = "Assertion \'_ck_x != NULL\' failed";
        pcVar8 = "Assertion \'%s\' failed: %s == %#x";
        pcVar7 = "(void*) array.growStrategy != NULL";
        pcVar3 = "(void*) array.growStrategy";
        iVar2 = 0x6a3;
        goto LAB_00117e15;
      }
      uStack_60 = 0x117cac;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x6a3);
      pcStack_90 = local_20;
      if (local_20 == (char *)0x0) {
        pcStack_90 = "(null)";
        pcVar8 = "";
      }
      else {
        uStack_60 = 0x117cc9;
        iVar2 = strcmp("012",local_20);
        if (iVar2 == 0) {
          uStack_60 = 0x117ce2;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x6a4);
          uStack_60 = 0x117ceb;
          (*pcStack_40)(local_20);
          return;
        }
        pcVar8 = "\"";
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar6 = "array.buffer == \"012\"";
      pcVar7 = "array.buffer";
      iVar2 = 0x6a4;
      local_68 = "\"";
      local_70 = "012";
      local_78 = "\"";
      pcStack_80 = "\"012\"";
      ppcVar5 = &pcStack_90;
      pcStack_88 = pcVar8;
      goto LAB_00117e7f;
    }
    pcVar6 = "array.capacity == 3";
    pcVar7 = "array.capacity";
    iVar2 = 0x6a1;
    pcVar8 = local_28;
  }
  else {
    pcVar6 = "array.size == 3";
    pcVar7 = "array.size";
    iVar2 = 0x6a0;
    pcVar8 = local_30;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  local_68 = (char *)0x3;
  ppcVar5 = &local_70;
  local_70 = "3";
LAB_00117e7f:
  uStack_60 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar8;
  *(code **)((long)ppcVar5 + -0x10) = test_ADynArray_set_failure_nullptr_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar3,pcVar6,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_set_failure_indexBeyondSize_bufferExpansionFailed)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 3;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 3;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity + 1);
    memcpy(array.buffer, "012", 4);
    private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
    private_ACUtilsTest_ADynArray_reallocFail = true;
    char c = '3';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_set(&array, 3, c), false);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 3);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 3);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "012");
    array.deallocator(array.buffer);
}